

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::r_formatter<spdlog::details::scoped_padder>::format
          (r_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  memory_buf_t *dest_00;
  padding_info *ppVar1;
  tm *in_RDX;
  scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffff68;
  buffer<char> *in_stack_ffffffffffffff70;
  scoped_padder *this_00;
  memory_buf_t *in_stack_ffffffffffffff78;
  padding_info *in_stack_ffffffffffffff80;
  padding_info *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff91;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffff92;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff93;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffff94;
  memory_buf_t *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  
  scoped_padder::scoped_padder
            ((scoped_padder *)
             CONCAT44(in_stack_ffffffffffffff94,
                      CONCAT13(in_stack_ffffffffffffff93,
                               CONCAT12(in_stack_ffffffffffffff92,
                                        CONCAT11(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90
                                                )))),(size_t)in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  to12h(in_RDX);
  fmt_helper::pad2(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
  uVar4 = 0x3a;
  fmt::v9::detail::buffer<char>::push_back(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  fmt_helper::pad2(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
  uVar3 = 0x3a;
  fmt::v9::detail::buffer<char>::push_back(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  fmt_helper::pad2(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
  uVar2 = 0x20;
  fmt::v9::detail::buffer<char>::push_back(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  dest_00 = (memory_buf_t *)ampm(in_RDX);
  this_00 = (scoped_padder *)&stack0xffffffffffffff88;
  ppVar1 = (padding_info *)std::char_traits<char>::length((char_type *)0x2081a0);
  this_00->padinfo_ = ppVar1;
  view.size_._0_1_ = in_stack_ffffffffffffff90;
  view.data_ = (char *)in_stack_ffffffffffffff88;
  view.size_._1_1_ = uVar2;
  view.size_._2_1_ = uVar3;
  view.size_._3_1_ = uVar4;
  view.size_._4_4_ = in_stack_ffffffffffffff94;
  fmt_helper::append_string_view(view,dest_00);
  scoped_padder::~scoped_padder(this_00);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }